

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableEndRow(ImGuiTable *table)

{
  ImVec4 *pIVar1;
  ImVec2 IVar2;
  char cVar3;
  ImGuiWindow *pIVar4;
  ImDrawList *pIVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  undefined1 auVar8 [16];
  ImGuiContext_conflict1 *pIVar9;
  int iVar10;
  ImGuiTableColumn *p_1;
  ImGuiTableColumn *pIVar11;
  char *__function;
  ImGuiTableColumn *p;
  long lVar12;
  ImGuiTableColumn *pIVar13;
  int iVar14;
  ImGuiTableCellData *cell_data;
  ImGuiTableCellData *pIVar15;
  int iVar16;
  ImGuiTableCellData *pIVar17;
  int iVar18;
  ImU32 col;
  ImU32 col_00;
  uint uVar19;
  uint uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 uVar27;
  undefined1 auVar26 [16];
  float fVar28;
  float fVar29;
  float fVar31;
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  ImRect IVar33;
  ImVec2 local_80;
  ImVec2 local_78;
  ImU32 local_70;
  int local_6c;
  int local_68;
  int local_64;
  ImVec2 local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  pIVar9 = GImGui;
  pIVar4 = (ImGuiWindow *)GImGui->CurrentWindow;
  if (pIVar4 != table->InnerWindow) {
    __assert_fail("window == table->InnerWindow",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                  ,0x6c3,"void ImGui::TableEndRow(ImGuiTable *)");
  }
  if (table->IsInsideRow == false) {
    __assert_fail("table->IsInsideRow",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                  ,0x6c4,"void ImGui::TableEndRow(ImGuiTable *)");
  }
  if (table->CurrentColumn != -1) {
    TableEndCell(table);
  }
  if (pIVar9->LogEnabled == true) {
    LogRenderedText((ImVec2 *)0x0,"|",(char *)0x0);
  }
  fVar29 = table->RowPosY2;
  auVar25 = ZEXT416((uint)fVar29);
  (pIVar4->DC).CursorPos.y = fVar29;
  fVar28 = table->RowPosY1;
  auVar21 = ZEXT416((uint)fVar28);
  iVar10 = table->CurrentRow;
  if (iVar10 == 0) {
    table->LastFirstRowHeight = fVar29 - fVar28;
  }
  iVar14 = iVar10 + 1;
  iVar16 = (int)table->FreezeRowsCount;
  iVar18 = (int)table->FreezeRowsRequest;
  if (((table->InnerClipRect).Min.y <= fVar29) && (fVar28 <= (table->InnerClipRect).Max.y)) {
    col_00 = table->RowBgColor[0];
    local_6c = iVar18;
    local_58 = auVar21;
    local_48 = auVar25;
    if ((col_00 == 0x1000000) && (col_00 = 0, (table->Flags & 0x40) != 0)) {
      col_00 = GetColorU32((table->RowBgColorCounter & 1U) + 0x2f,1.0);
      iVar10 = table->CurrentRow;
    }
    col = table->RowBgColor[1];
    local_70 = 0;
    if (col == 0x1000000) {
      col = 0;
    }
    if (((0 < iVar10) || (table->InnerWindow == table->OuterWindow)) &&
       (local_70 = 0, (table->Flags & 0x80) != 0)) {
      local_70 = table->RowBgColor[(ulong)((table->field_0x9a & 1) == 0) + 2];
    }
    cVar3 = table->RowCellDataCurrent;
    local_64 = iVar14;
    if ((-1 < cVar3 || iVar14 == iVar16) || (local_70 != 0 || (col != 0 || col_00 != 0))) {
      if ((table->Flags & 0x100000) == 0) {
        fVar29 = (table->Bg0ClipRectForDrawCmd).Min.y;
        fVar28 = (table->Bg0ClipRectForDrawCmd).Max.x;
        fVar31 = (table->Bg0ClipRectForDrawCmd).Max.y;
        pIVar5 = pIVar4->DrawList;
        (pIVar5->_CmdHeader).ClipRect.x = (table->Bg0ClipRectForDrawCmd).Min.x;
        (pIVar5->_CmdHeader).ClipRect.y = fVar29;
        (pIVar5->_CmdHeader).ClipRect.z = fVar28;
        (pIVar5->_CmdHeader).ClipRect.w = fVar31;
      }
      ImDrawListSplitter::SetCurrentChannel(table->DrawSplitter,pIVar4->DrawList,0);
    }
    if (col != 0 || col_00 != 0) {
      IVar2 = (table->BgClipRect).Min;
      fVar29 = (table->WorkRect).Min.x;
      fVar28 = IVar2.x;
      fVar31 = IVar2.y;
      uVar19 = -(uint)(fVar28 <= fVar29);
      uVar20 = -(uint)(fVar31 <= (float)local_58._0_4_);
      auVar32._0_4_ = (uint)fVar29 & uVar19;
      auVar32._4_4_ = local_58._0_4_ & uVar20;
      auVar32._8_4_ = 0;
      auVar32._12_4_ = local_58._4_4_ & -(uint)(0.0 <= (float)local_58._4_4_);
      auVar24._0_4_ = ~uVar19 & (uint)fVar28;
      auVar24._4_4_ = ~uVar20 & (uint)fVar31;
      auVar24._8_8_ = 0;
      auVar25 = auVar24 | auVar32;
      local_80 = auVar25._0_8_;
      auVar30._8_8_ = 0;
      auVar30._0_4_ = (table->BgClipRect).Max.x;
      auVar30._4_4_ = (table->BgClipRect).Max.y;
      auVar21._4_4_ = local_48._0_4_;
      auVar21._0_4_ = (table->WorkRect).Max.x;
      auVar21._8_4_ = 0;
      auVar21._12_4_ = local_48._4_4_;
      auVar21 = minps(auVar21,auVar30);
      local_78 = auVar21._0_8_;
      if ((col_00 != 0) &&
         (uVar19 = -(uint)(auVar25._4_4_ < auVar21._4_4_),
         auVar8._4_4_ = -(uint)(auVar25._8_4_ < auVar21._8_4_), auVar8._0_4_ = uVar19,
         auVar8._8_4_ = -(uint)(auVar25._12_4_ < auVar21._12_4_), auVar8._12_4_ = 0,
         auVar25 = auVar8 << 0x20, (uVar19 & 1) != 0)) {
        ImDrawList::AddRectFilled(pIVar4->DrawList,&local_80,&local_78,col_00,0.0,0);
      }
      if (col != 0) {
        if (local_80.y < local_78.y) {
          ImDrawList::AddRectFilled(pIVar4->DrawList,&local_80,&local_78,col,0.0,0);
        }
      }
    }
    local_68 = iVar16;
    if (-1 < cVar3) {
      if (-1 < (long)table->RowCellDataCurrent) {
        pIVar15 = (table->RowCellData).Data;
        pIVar17 = pIVar15 + table->RowCellDataCurrent;
        if (pIVar17 < (table->RowCellData).DataEnd) {
          do {
            uVar27 = auVar25._8_8_;
            cVar3 = pIVar15->Column;
            if (((long)cVar3 < 0) ||
               (pIVar11 = (table->Columns).Data + cVar3, (table->Columns).DataEnd <= pIVar11))
            goto LAB_00215534;
            IVar33 = TableGetCellBgRect(table,(int)cVar3);
            auVar26._0_8_ = IVar33.Max;
            auVar26._8_8_ = uVar27;
            IVar2 = (table->BgClipRect).Min;
            fVar29 = IVar2.x;
            fVar28 = IVar2.y;
            uVar19 = -(uint)(fVar29 <= IVar33.Min.x);
            uVar20 = -(uint)(fVar28 <= IVar33.Min.y);
            fVar31 = (float)(~uVar19 & (uint)fVar29 | (uint)IVar33.Min.x & uVar19);
            auVar22._8_8_ = 0;
            auVar22._0_4_ = (table->BgClipRect).Max.x;
            auVar22._4_4_ = (table->BgClipRect).Max.y;
            auVar21 = minps(auVar26,auVar22);
            fVar29 = (pIVar11->ClipRect).Min.x;
            uVar19 = -(uint)(fVar29 <= fVar31);
            local_80.y = (float)(~uVar20 & (uint)fVar28 | (uint)IVar33.Min.y & uVar20);
            local_80.x = (float)(~uVar19 & (uint)fVar29 | (uint)fVar31 & uVar19);
            auVar25 = auVar21;
            if (pIVar11->MaxX <= auVar21._0_4_) {
              auVar25._4_12_ = auVar21._4_12_;
              auVar25._0_4_ = pIVar11->MaxX;
            }
            local_78.y = auVar21._4_4_;
            local_78.x = auVar25._0_4_;
            ImDrawList::AddRectFilled(pIVar4->DrawList,&local_80,&local_78,pIVar15->BgColor,0.0,0);
            pIVar15 = pIVar15 + 1;
          } while (pIVar15 <= pIVar17);
          goto LAB_002152ad;
        }
      }
      __function = "T &ImSpan<ImGuiTableCellData>::operator[](int) [T = ImGuiTableCellData]";
      goto LAB_00215549;
    }
LAB_002152ad:
    if (((local_70 != 0) && ((table->BgClipRect).Min.y <= (float)local_58._0_4_)) &&
       ((float)local_58._0_4_ < (table->BgClipRect).Max.y)) {
      local_80.y = (float)local_58._0_4_;
      local_80.x = table->BorderX1;
      local_60.x = table->BorderX2;
      local_60.y = (float)local_58._0_4_;
      ImDrawList::AddLine(pIVar4->DrawList,&local_80,&local_60,local_70,1.0);
    }
    iVar14 = local_64;
    iVar16 = local_68;
    iVar18 = local_6c;
    if (((local_64 == local_68) && ((table->BgClipRect).Min.y <= (float)local_48._0_4_)) &&
       ((float)local_48._0_4_ < (table->BgClipRect).Max.y)) {
      local_80.y = (float)local_48._0_4_;
      local_80.x = table->BorderX1;
      local_60.x = table->BorderX2;
      local_60.y = (float)local_48._0_4_;
      ImDrawList::AddLine(pIVar4->DrawList,&local_80,&local_60,table->BorderColorStrong,1.0);
    }
  }
  if ((iVar14 == iVar18) && (iVar10 = table->ColumnsCount, 0 < (long)iVar10)) {
    pIVar11 = (table->Columns).Data;
    lVar12 = 0;
    do {
      if ((table->Columns).DataEnd <= pIVar11) goto LAB_00215534;
      pIVar11->NavLayerCurrent = lVar12 < table->FreezeColumnsCount;
      lVar12 = lVar12 + 1;
      pIVar11 = pIVar11 + 1;
    } while (iVar10 != lVar12);
  }
  if (iVar14 != iVar16) {
LAB_0021550f:
    if ((table->field_0x98 & 1) == 0) {
      table->RowBgColorCounter = table->RowBgColorCounter + 1;
    }
    table->IsInsideRow = false;
    return;
  }
  if (table->IsUnfrozenRows != false) {
    __assert_fail("table->IsUnfrozenRows == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                  ,0x727,"void ImGui::TableEndRow(ImGuiTable *)");
  }
  table->IsUnfrozenRows = true;
  fVar29 = table->RowPosY2;
  fVar28 = (pIVar4->InnerClipRect).Min.y;
  fVar31 = (pIVar4->InnerClipRect).Max.y;
  uVar19 = -(uint)(fVar28 <= fVar29 + 1.0);
  fVar28 = (float)(~uVar19 & (uint)fVar28 | (uint)(fVar29 + 1.0) & uVar19);
  if (fVar31 <= fVar28) {
    fVar28 = fVar31;
  }
  (table->Bg2ClipRectForDrawCmd).Min.y = fVar28;
  (table->BgClipRect).Min.y = fVar28;
  (table->Bg2ClipRectForDrawCmd).Max.y = fVar31;
  (table->BgClipRect).Max.y = fVar31;
  table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
  if (fVar31 < fVar28) {
    __assert_fail("table->Bg2ClipRectForDrawCmd.Min.y <= table->Bg2ClipRectForDrawCmd.Max.y",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                  ,0x72f,"void ImGui::TableEndRow(ImGuiTable *)");
  }
  fVar31 = table->RowPosY1;
  fVar23 = (fVar29 + (table->WorkRect).Min.y) - (table->OuterRect).Min.y;
  (pIVar4->DC).CursorPos.y = fVar23;
  table->RowPosY2 = fVar23;
  table->RowPosY1 = fVar23 - (fVar29 - fVar31);
  lVar12 = (long)table->ColumnsCount;
  pIVar11 = (table->Columns).Data;
  pIVar13 = pIVar11;
  if (0 < lVar12) {
    do {
      if ((table->Columns).DataEnd <= pIVar13) goto LAB_00215534;
      pIVar13->DrawChannelCurrent = pIVar13->DrawChannelUnfrozen;
      (pIVar13->ClipRect).Min.y = fVar28;
      lVar12 = lVar12 + -1;
      pIVar13 = pIVar13 + 1;
    } while (lVar12 != 0);
  }
  if (pIVar11 < (table->Columns).DataEnd) {
    IVar2 = (pIVar11->ClipRect).Min;
    IVar6 = (pIVar11->ClipRect).Max;
    IVar7 = (pIVar11->ClipRect).Max;
    (pIVar4->ClipRect).Min = (pIVar11->ClipRect).Min;
    (pIVar4->ClipRect).Max = IVar7;
    pIVar5 = pIVar4->DrawList;
    (pIVar5->_CmdHeader).ClipRect.x = IVar2.x;
    (pIVar5->_CmdHeader).ClipRect.y = IVar2.y;
    (pIVar5->_CmdHeader).ClipRect.z = IVar6.x;
    (pIVar5->_CmdHeader).ClipRect.w = IVar6.y;
    pIVar1 = (pIVar4->DrawList->_ClipRectStack).Data +
             (long)(pIVar4->DrawList->_ClipRectStack).Size + -1;
    pIVar1->x = IVar2.x;
    pIVar1->y = IVar2.y;
    pIVar1->z = IVar6.x;
    pIVar1->w = IVar6.y;
    pIVar11 = (table->Columns).Data;
    if (pIVar11 < (table->Columns).DataEnd) {
      ImDrawListSplitter::SetCurrentChannel
                (table->DrawSplitter,pIVar4->DrawList,(uint)pIVar11->DrawChannelCurrent);
      goto LAB_0021550f;
    }
  }
LAB_00215534:
  __function = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
LAB_00215549:
  __assert_fail("p >= Data && p < DataEnd",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_internal.h"
                ,0x24a,__function);
}

Assistant:

void ImGui::TableEndRow(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(window == table->InnerWindow);
    IM_ASSERT(table->IsInsideRow);

    if (table->CurrentColumn != -1)
        TableEndCell(table);

    // Logging
    if (g.LogEnabled)
        LogRenderedText(NULL, "|");

    // Position cursor at the bottom of our row so it can be used for e.g. clipping calculation. However it is
    // likely that the next call to TableBeginCell() will reposition the cursor to take account of vertical padding.
    window->DC.CursorPos.y = table->RowPosY2;

    // Row background fill
    const float bg_y1 = table->RowPosY1;
    const float bg_y2 = table->RowPosY2;
    const bool unfreeze_rows_actual = (table->CurrentRow + 1 == table->FreezeRowsCount);
    const bool unfreeze_rows_request = (table->CurrentRow + 1 == table->FreezeRowsRequest);
    if (table->CurrentRow == 0)
        table->LastFirstRowHeight = bg_y2 - bg_y1;

    const bool is_visible = (bg_y2 >= table->InnerClipRect.Min.y && bg_y1 <= table->InnerClipRect.Max.y);
    if (is_visible)
    {
        // Decide of background color for the row
        ImU32 bg_col0 = 0;
        ImU32 bg_col1 = 0;
        if (table->RowBgColor[0] != IM_COL32_DISABLE)
            bg_col0 = table->RowBgColor[0];
        else if (table->Flags & ImGuiTableFlags_RowBg)
            bg_col0 = GetColorU32((table->RowBgColorCounter & 1) ? ImGuiCol_TableRowBgAlt : ImGuiCol_TableRowBg);
        if (table->RowBgColor[1] != IM_COL32_DISABLE)
            bg_col1 = table->RowBgColor[1];

        // Decide of top border color
        ImU32 border_col = 0;
        const float border_size = TABLE_BORDER_SIZE;
        if (table->CurrentRow > 0 || table->InnerWindow == table->OuterWindow)
            if (table->Flags & ImGuiTableFlags_BordersInnerH)
                border_col = (table->LastRowFlags & ImGuiTableRowFlags_Headers) ? table->BorderColorStrong : table->BorderColorLight;

        const bool draw_cell_bg_color = table->RowCellDataCurrent >= 0;
        const bool draw_strong_bottom_border = unfreeze_rows_actual;
        if ((bg_col0 | bg_col1 | border_col) != 0 || draw_strong_bottom_border || draw_cell_bg_color)
        {
            // In theory we could call SetWindowClipRectBeforeSetChannel() but since we know TableEndRow() is
            // always followed by a change of clipping rectangle we perform the smallest overwrite possible here.
            if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
                window->DrawList->_CmdHeader.ClipRect = table->Bg0ClipRectForDrawCmd.ToVec4();
            table->DrawSplitter->SetCurrentChannel(window->DrawList, TABLE_DRAW_CHANNEL_BG0);
        }

        // Draw row background
        // We soft/cpu clip this so all backgrounds and borders can share the same clipping rectangle
        if (bg_col0 || bg_col1)
        {
            ImRect row_rect(table->WorkRect.Min.x, bg_y1, table->WorkRect.Max.x, bg_y2);
            row_rect.ClipWith(table->BgClipRect);
            if (bg_col0 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col0);
            if (bg_col1 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col1);
        }

        // Draw cell background color
        if (draw_cell_bg_color)
        {
            ImGuiTableCellData* cell_data_end = &table->RowCellData[table->RowCellDataCurrent];
            for (ImGuiTableCellData* cell_data = &table->RowCellData[0]; cell_data <= cell_data_end; cell_data++)
            {
                const ImGuiTableColumn* column = &table->Columns[cell_data->Column];
                ImRect cell_bg_rect = TableGetCellBgRect(table, cell_data->Column);
                cell_bg_rect.ClipWith(table->BgClipRect);
                cell_bg_rect.Min.x = ImMax(cell_bg_rect.Min.x, column->ClipRect.Min.x);     // So that first column after frozen one gets clipped
                cell_bg_rect.Max.x = ImMin(cell_bg_rect.Max.x, column->MaxX);
                window->DrawList->AddRectFilled(cell_bg_rect.Min, cell_bg_rect.Max, cell_data->BgColor);
            }
        }

        // Draw top border
        if (border_col && bg_y1 >= table->BgClipRect.Min.y && bg_y1 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y1), ImVec2(table->BorderX2, bg_y1), border_col, border_size);

        // Draw bottom border at the row unfreezing mark (always strong)
        if (draw_strong_bottom_border && bg_y2 >= table->BgClipRect.Min.y && bg_y2 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y2), ImVec2(table->BorderX2, bg_y2), table->BorderColorStrong, border_size);
    }

    // End frozen rows (when we are past the last frozen row line, teleport cursor and alter clipping rectangle)
    // We need to do that in TableEndRow() instead of TableBeginRow() so the list clipper can mark end of row and
    // get the new cursor position.
    if (unfreeze_rows_request)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->NavLayerCurrent = (ImS8)((column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);
        }
    if (unfreeze_rows_actual)
    {
        IM_ASSERT(table->IsUnfrozenRows == false);
        table->IsUnfrozenRows = true;

        // BgClipRect starts as table->InnerClipRect, reduce it now and make BgClipRectForDrawCmd == BgClipRect
        float y0 = ImMax(table->RowPosY2 + 1, window->InnerClipRect.Min.y);
        table->BgClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y = ImMin(y0, window->InnerClipRect.Max.y);
        table->BgClipRect.Max.y = table->Bg2ClipRectForDrawCmd.Max.y = window->InnerClipRect.Max.y;
        table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
        IM_ASSERT(table->Bg2ClipRectForDrawCmd.Min.y <= table->Bg2ClipRectForDrawCmd.Max.y);

        float row_height = table->RowPosY2 - table->RowPosY1;
        table->RowPosY2 = window->DC.CursorPos.y = table->WorkRect.Min.y + table->RowPosY2 - table->OuterRect.Min.y;
        table->RowPosY1 = table->RowPosY2 - row_height;
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->DrawChannelCurrent = column->DrawChannelUnfrozen;
            column->ClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y;
        }

        // Update cliprect ahead of TableBeginCell() so clipper can access to new ClipRect->Min.y
        SetWindowClipRectBeforeSetChannel(window, table->Columns[0].ClipRect);
        table->DrawSplitter->SetCurrentChannel(window->DrawList, table->Columns[0].DrawChannelCurrent);
    }

    if (!(table->RowFlags & ImGuiTableRowFlags_Headers))
        table->RowBgColorCounter++;
    table->IsInsideRow = false;
}